

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::(anonymous_namespace)::node_copy_string<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               unsigned_long *source_header,xml_allocator *alloc)

{
  uintptr_t in_RCX;
  char_t *in_RDX;
  ulong *in_RSI;
  uintptr_t *in_RDI;
  char **in_R8;
  unsigned_long *in_R9;
  
  if (in_RCX != 0) {
    if ((in_R9 == (unsigned_long *)0x0) || (((ulong)*in_R8 & (ulong)in_RDX) != 0)) {
      anon_unknown_0::strlength((char_t *)0x153eb8);
      strcpy_insitu<char*,unsigned_long>(in_R8,in_R9,in_RCX,in_RDX,(size_t)in_RSI);
    }
    else {
      *in_RDI = in_RCX;
      *in_RSI = *in_RSI | 0x40;
      *in_R8 = (char *)((ulong)*in_R8 | 0x40);
    }
  }
  return;
}

Assistant:

PUGI_IMPL_FN void node_copy_string(String& dest, Header& header, uintptr_t header_mask, char_t* source, Header& source_header, xml_allocator* alloc)
	{
		assert(!dest && (header & header_mask) == 0); // copies are performed into fresh nodes

		if (source)
		{
			if (alloc && (source_header & header_mask) == 0)
			{
				dest = source;

				// since strcpy_insitu can reuse document buffer memory we need to mark both source and dest as shared
				header |= xml_memory_page_contents_shared_mask;
				source_header |= xml_memory_page_contents_shared_mask;
			}
			else
				strcpy_insitu(dest, header, header_mask, source, strlength(source));
		}
	}